

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_fcmlah_idx_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ushort uVar1;
  ushort uVar2;
  float16 fVar3;
  float16 fVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uintptr_t i;
  ulong local_80;
  ulong uVar7;
  
  uVar5 = desc * 8 & 0xff;
  uVar6 = uVar5 + 8;
  uVar7 = (ulong)uVar6;
  uVar10 = desc >> 10 & 1;
  uVar12 = desc >> 0xb & 1;
  local_80 = 0;
  do {
    uVar8 = local_80 | desc >> 0xb & 6;
    uVar1 = *(ushort *)((long)vm + uVar8 * 2);
    uVar2 = *(ushort *)((long)vm + uVar8 * 2 + 2);
    uVar9 = uVar1;
    if (uVar10 == 0) {
      uVar9 = uVar2;
      uVar2 = uVar1;
    }
    uVar8 = local_80 + 8;
    do {
      fVar4 = *(float16 *)((long)vn + local_80 * 2 + (ulong)uVar10 * 2);
      fVar3 = float16_muladd_arm(fVar4,uVar2 ^ (ushort)((uVar10 ^ uVar12) << 0xf),
                                 *(float16 *)((long)vd + local_80 * 2),0,(float_status *)vfpst);
      *(float16 *)((long)vd + local_80 * 2) = fVar3;
      fVar4 = float16_muladd_arm(fVar4,uVar9 ^ (ushort)(uVar12 << 0xf),
                                 *(float16 *)((long)vd + local_80 * 2 + 2),0,(float_status *)vfpst);
      *(float16 *)((long)vd + local_80 * 2 + 2) = fVar4;
      local_80 = local_80 + 2;
    } while (local_80 < uVar8);
    local_80 = uVar8;
  } while (uVar8 < uVar6 >> 1);
  uVar6 = desc >> 2 & 0xf8;
  if (uVar6 <= uVar5) {
    return;
  }
  uVar11 = (ulong)(uVar6 + 8);
  uVar8 = uVar7 + 8;
  if (uVar7 + 8 < uVar11) {
    uVar8 = uVar11;
  }
  memset((void *)((long)vd + uVar7),0,(~uVar7 + uVar8 & 0xfffffffffffffff8) + 8);
  return;
}

Assistant:

void HELPER(gvec_fcmlah_idx)(void *vd, void *vn, void *vm,
                             void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    intptr_t index = extract32(desc, SIMD_DATA_SHIFT + 2, 2);
    uint32_t neg_real = flip ^ neg_imag;
    intptr_t elements = opr_sz / sizeof(float16);
    intptr_t eltspersegment = 16 / sizeof(float16);
    intptr_t i, j;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < elements; i += eltspersegment) {
        float16 mr = m[H2(i + 2 * index + 0)];
        float16 mi = m[H2(i + 2 * index + 1)];
        float16 e1 = neg_real ^ (flip ? mi : mr);
        float16 e3 = neg_imag ^ (flip ? mr : mi);

        for (j = i; j < i + eltspersegment; j += 2) {
            float16 e2 = n[H2(j + flip)];
            float16 e4 = e2;

            d[H2(j)] = float16_muladd(e2, e1, d[H2(j)], 0, fpst);
            d[H2(j + 1)] = float16_muladd(e4, e3, d[H2(j + 1)], 0, fpst);
        }
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}